

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflatePrime(z_streamp strm,int bits,int value)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  int value_local;
  int bits_local;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (bits < 0) {
      piVar1->w_size = 0;
      piVar1->w_bits = 0;
      piVar1->w_mask = 0;
      strm_local._4_4_ = 0;
    }
    else if ((bits < 0x11) && (piVar1->w_mask + bits < 0x21)) {
      *(ulong *)&piVar1->w_size =
           (ulong)((value & (int)(1L << ((byte)bits & 0x3f)) - 1U) << ((byte)piVar1->w_mask & 0x1f))
           + *(long *)&piVar1->w_size;
      piVar1->w_mask = bits + piVar1->w_mask;
      strm_local._4_4_ = 0;
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (uInt)bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (unsigned)value << state->bits;
    state->bits += (uInt)bits;
    return Z_OK;
}